

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void common_set_adapter_lora
               (llama_context *ctx,
               vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *lora)

{
  pointer pcVar1;
  common_adapter_lora_info *la;
  pointer pcVar2;
  
  llama_clear_adapter_lora();
  pcVar1 = (lora->
           super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pcVar2 = (lora->
                super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>
                )._M_impl.super__Vector_impl_data._M_start; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
    if ((pcVar2->scale != 0.0) || (NAN(pcVar2->scale))) {
      llama_set_adapter_lora(ctx,pcVar2->ptr);
    }
  }
  return;
}

Assistant:

void common_set_adapter_lora(struct llama_context * ctx, std::vector<common_adapter_lora_info> & lora) {
    llama_clear_adapter_lora(ctx);
    for (auto & la : lora) {
        if (la.scale != 0.0f) {
            llama_set_adapter_lora(ctx, la.ptr, la.scale);
        }
    }
}